

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedReadsDatastore.cc
# Opt level: O0

void __thiscall
LinkedReadsDatastore::LinkedReadsDatastore
          (LinkedReadsDatastore *this,WorkSpace *ws,string *filename,ifstream *infile)

{
  char *pcVar1;
  FILE *pFVar2;
  runtime_error *prVar3;
  uint *puVar4;
  streamoff sVar5;
  ostream *poVar6;
  size_t sVar7;
  void *this_00;
  char *in_RCX;
  string *in_RDX;
  undefined8 in_RSI;
  string *in_RDI;
  SDG_FILETYPE type;
  sdgVersion_t version;
  sdgMagic_t magic;
  uint64_t s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc8;
  size_type in_stack_fffffffffffffdd8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_fffffffffffffde0;
  undefined8 in_stack_fffffffffffffde8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdf8;
  LinkedReadsDatastore *in_stack_fffffffffffffe00;
  WorkSpace *in_stack_fffffffffffffe08;
  int __val;
  LinkedReadsMapper *in_stack_fffffffffffffe10;
  fpos local_188 [23];
  undefined1 local_171;
  string local_130 [39];
  undefined1 local_109;
  string local_88 [39];
  undefined1 local_61;
  string local_60 [34];
  short local_3e;
  ushort local_3c;
  short local_3a;
  int local_38 [6];
  char *local_20;
  undefined8 local_10;
  
  local_20 = in_RCX;
  local_10 = in_RSI;
  std::__cxx11::string::string(in_RDI);
  LinkedReadsMapper::LinkedReadsMapper
            (in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
  std::__cxx11::string::string(in_RDI + 0xd0);
  std::__cxx11::string::string(in_RDI + 0xf0);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3c4149);
  *(undefined8 *)(in_RDI + 0x128) = 0;
  *(undefined8 *)(in_RDI + 0x130) = local_10;
  std::__cxx11::string::operator=(in_RDX,in_RDX);
  pcVar1 = (char *)std::__cxx11::string::c_str();
  pFVar2 = fopen(pcVar1,"r");
  *(FILE **)(in_RDI + 0x128) = pFVar2;
  fread(&local_3a,2,1,*(FILE **)(in_RDI + 0x128));
  fread(&local_3c,2,1,*(FILE **)(in_RDI + 0x128));
  fread(&local_3e,2,1,*(FILE **)(in_RDI + 0x128));
  if (local_3a != 0x5d6) {
    local_61 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+((char *)in_stack_fffffffffffffe08,&in_stack_fffffffffffffe00->filename);
    std::runtime_error::runtime_error(prVar3,local_60);
    local_61 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_3c < 3) {
    local_109 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    __val = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
    std::__cxx11::to_string(__val);
    std::operator+((char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    std::__cxx11::to_string(__val);
    std::operator+(in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0);
    std::runtime_error::runtime_error(prVar3,local_88);
    local_109 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  if (local_3e != 3) {
    local_171 = 1;
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string((int)((ulong)in_stack_fffffffffffffe08 >> 0x20));
    std::operator+((char *)in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
    std::operator+(in_stack_fffffffffffffdc8,(char *)in_stack_fffffffffffffdc0);
    std::runtime_error::runtime_error(prVar3,local_130);
    local_171 = 0;
    __cxa_throw(prVar3,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::istream::read(local_20,(long)(in_RDI + 0x20));
  std::istream::read(local_20,(long)local_38);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
            (in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
  pcVar1 = local_20;
  puVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::data
                     ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x3c46c1);
  std::istream::read(pcVar1,(long)puVar4);
  local_188._0_16_ = std::istream::tellg();
  sVar5 = std::fpos::operator_cast_to_long(local_188);
  *(streamoff *)(in_RDI + 0x28) = sVar5;
  fseek(*(FILE **)(in_RDI + 0x128),*(long *)(in_RDI + 0x28),0);
  std::istream::seekg((long)local_20,local_38[0] * ((int)*(undefined8 *)(in_RDI + 0x20) + 1) * 2);
  poVar6 = sdglib::OutputLog((LogLevels)((ulong)in_stack_fffffffffffffde8 >> 0x20),
                             SUB81((ulong)in_stack_fffffffffffffde8 >> 0x18,0));
  poVar6 = std::operator<<(poVar6,"LinkedReadsDatastore open: ");
  poVar6 = std::operator<<(poVar6,in_RDX);
  poVar6 = std::operator<<(poVar6,"  max read length: ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,*(ulong *)(in_RDI + 0x20));
  poVar6 = std::operator<<(poVar6," Total reads: ");
  sVar7 = size((LinkedReadsDatastore *)0x3c4818);
  this_00 = (void *)std::ostream::operator<<(poVar6,sVar7);
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

LinkedReadsDatastore::LinkedReadsDatastore(WorkSpace &ws, std::string filename, std::ifstream &infile) : ws(ws), mapper(ws, *this) {
    uint64_t s;
    filename=filename;
    fd=fopen(filename.c_str(),"r");
    sdgMagic_t magic;
    sdgVersion_t version;
    SDG_FILETYPE type;
    fread((char *) &magic, sizeof(magic),1,fd);
    fread((char *) &version, sizeof(version),1,fd);
    fread((char *) &type, sizeof(type),1,fd);

    if (magic != SDG_MAGIC) {
        throw std::runtime_error("Magic number not present in " + filename);
    }

    if (version < min_compat) {
        throw std::runtime_error("LinkedDS file version: " + std::to_string(version) + " is not compatible with " + std::to_string(min_compat));
    }

    if (type != LinkedDS_FT) {
        throw std::runtime_error("File type supplied: " + std::to_string(type) + " is not compatible with LinkedDS_FT");
    }

    infile.read( (char *) &readsize,sizeof(readsize));
    infile.read( (char *) &s,sizeof(s));
    read_tag.resize(s);
    infile.read( (char *) read_tag.data(),sizeof(read_tag[0])*s);
    readpos_offset=infile.tellg();
    fseek(fd,readpos_offset,SEEK_SET);
    infile.seekg(2*s*(readsize+1),std::ios_base::cur);
    sdglib::OutputLog()<<"LinkedReadsDatastore open: "<<filename<<"  max read length: "<<readsize<<" Total reads: " <<size()<<std::endl;
}